

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O2

void PopInterval(CostManager *manager,CostInterval *interval)

{
  CostInterval *pCVar1;
  CostInterval *pCVar2;
  bool bVar3;
  CostManager *pCVar4;
  
  pCVar1 = interval->previous_;
  pCVar2 = interval->next_;
  pCVar4 = (CostManager *)&pCVar1->next_;
  if (pCVar1 == (CostInterval *)0x0) {
    pCVar4 = manager;
  }
  pCVar4->head_ = pCVar2;
  if (pCVar2 != (CostInterval *)0x0) {
    pCVar2->previous_ = pCVar1;
  }
  bVar3 = manager->intervals_ + 9 < interval || interval < manager->intervals_;
  pCVar1 = (&manager->free_intervals_)[bVar3];
  (&manager->free_intervals_)[bVar3] = interval;
  interval->next_ = pCVar1;
  manager->count_ = manager->count_ + -1;
  return;
}

Assistant:

static WEBP_INLINE void PopInterval(CostManager* const manager,
                                    CostInterval* const interval) {
  if (interval == NULL) return;

  ConnectIntervals(manager, interval->previous_, interval->next_);
  if (CostIntervalIsInFreeList(manager, interval)) {
    CostIntervalAddToFreeList(manager, interval);
  } else {  // recycle regularly malloc'd intervals too
    interval->next_ = manager->recycled_intervals_;
    manager->recycled_intervals_ = interval;
  }
  --manager->count_;
  assert(manager->count_ >= 0);
}